

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool __thiscall ghc::filesystem::path::has_filename(path *this)

{
  bool bVar1;
  string local_30 [8];
  long local_28;
  
  bVar1 = has_relative_path(this);
  if (bVar1) {
    filename((path *)local_30,this);
    bVar1 = local_28 != 0;
    std::__cxx11::string::~string(local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

GHC_INLINE bool path::has_filename() const
{
    return has_relative_path() && !filename().empty();
}